

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

HMODULE PAL_RegisterLibraryDirect(void *dl_handle,LPCWSTR lpLibFileName)

{
  bool bVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  HMODULE local_78;
  HMODULE hModule;
  char *pcStack_68;
  INT name_length;
  CHAR *lpstr;
  LPCWSTR lpLibFileName_local;
  void *dl_handle_local;
  PathCharString pathstr;
  
  pathstr.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  lpstr = (CHAR *)lpLibFileName;
  lpLibFileName_local = (LPCWSTR)dl_handle;
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&dl_handle_local);
  pcStack_68 = (char *)0x0;
  local_78 = (HMODULE)0x0;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  bVar1 = LOADVerifyLibraryPath<char16_t>((char16_t *)lpstr);
  if (bVar1) {
    sVar2 = PAL_wcslen((char16_t *)lpstr);
    pcStack_68 = StackString<32UL,_char>::OpenStringBuffer
                           ((StackString<32UL,_char> *)&dl_handle_local,
                            (sVar2 + 1) * (long)MaxWCharToAcpLength);
    if ((pcStack_68 != (char *)0x0) &&
       (bVar1 = LOADConvertLibraryPathWideStringToMultibyteString
                          ((LPCWSTR)lpstr,pcStack_68,(INT *)((long)&hModule + 4)), bVar1)) {
      FILEDosToUnixPathA(pcStack_68);
      StackString<32UL,_char>::CloseBuffer
                ((StackString<32UL,_char> *)&dl_handle_local,(long)hModule._4_4_);
      LockModuleList();
      local_78 = LOADRegisterLibraryDirect(lpLibFileName_local,pcStack_68,1);
      UnlockModuleList();
    }
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&dl_handle_local);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != pathstr.m_count) {
      __stack_chk_fail();
    }
    return local_78;
  }
  abort();
}

Assistant:

HMODULE
PALAPI
PAL_RegisterLibraryDirect(
    IN void *dl_handle,
    IN LPCWSTR lpLibFileName)
{
    PathCharString pathstr;
    CHAR * lpstr = nullptr;
    INT name_length;
    HMODULE hModule = nullptr;

    PERF_ENTRY(RegisterLibraryDirect);
    ENTRY("RegisterLibraryDirect (lpLibFileName=%p (%S)) \n",
        lpLibFileName ? lpLibFileName : W16_NULLSTRING,
        lpLibFileName ? lpLibFileName : W16_NULLSTRING);

    if (!LOADVerifyLibraryPath(lpLibFileName))
    {
        goto done;
    }

    lpstr = pathstr.OpenStringBuffer((PAL_wcslen(lpLibFileName)+1) * MaxWCharToAcpLength);
    if (nullptr == lpstr)
    {
        goto done;
    }
    if (!LOADConvertLibraryPathWideStringToMultibyteString(lpLibFileName, lpstr, &name_length))
    {
        goto done;
    }

    /* do the Dos/Unix conversion on our own copy of the name */
    FILEDosToUnixPathA(lpstr);
    pathstr.CloseBuffer(name_length);

    /* let LOADRegisterLibraryDirect call SetLastError in case of failure */
    LockModuleList();
    hModule = LOADRegisterLibraryDirect((void *)dl_handle, lpstr, true /* fDynamic */);
    UnlockModuleList();

done:
    LOGEXIT("RegisterLibraryDirect returns HMODULE %p\n", hModule);
    PERF_EXIT(RegisterLibraryDirect);
    return hModule;
}